

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FastFieldValuePrinterUtf8Escaping::PrintString
          (FastFieldValuePrinterUtf8Escaping *this,string *val,BaseTextGenerator *generator)

{
  char (*in_RDX) [2];
  string *in_stack_00000058;
  char (*in_stack_ffffffffffffffa8) [2];
  BaseTextGenerator *in_stack_ffffffffffffffb0;
  BaseTextGenerator *this_00;
  string *in_stack_ffffffffffffffb8;
  BaseTextGenerator *in_stack_ffffffffffffffc0;
  BaseTextGenerator local_38 [4];
  char (*local_18) [2];
  
  local_18 = in_RDX;
  TextFormat::BaseTextGenerator::PrintLiteral<2ul>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = local_38;
  strings::Utf8SafeCEscape(in_stack_00000058);
  TextFormat::BaseTextGenerator::PrintString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)local_38);
  TextFormat::BaseTextGenerator::PrintLiteral<2ul>(this_00,local_18);
  return;
}

Assistant:

void PrintString(const std::string& val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintLiteral("\"");
    generator->PrintString(strings::Utf8SafeCEscape(val));
    generator->PrintLiteral("\"");
  }